

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,FileDescriptor *file,GeneratorOptions *options,GeneratorContext *context,
          bool use_short_name)

{
  undefined8 *puVar1;
  char *pcVar2;
  pointer pcVar3;
  long *plVar4;
  char ***pppcVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  LogMessage *other;
  string *annotation_collector_00;
  char *pcVar8;
  string filename;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  undefined8 *local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [48];
  Generator *local_f8;
  string local_f0;
  Printer local_d0;
  ZeroCopyOutputStream *output;
  
  pppcVar5 = (char ***)&local_d0.buffer_;
  pcVar3 = (options->output_dir)._M_dataplus._M_p;
  local_f8 = this;
  local_d0._0_8_ = pppcVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (options->output_dir)._M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  plVar4 = *(long **)file;
  if (use_short_name) {
    std::__cxx11::string::rfind((char)plVar4,0x2f);
    std::__cxx11::string::substr((ulong)&local_f0,(ulong)plVar4);
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f0,*plVar4,plVar4[1] + *plVar4);
  }
  anon_unknown_0::GetJSFilename((string *)local_128,options,&local_f0);
  pcVar2 = (char *)((long)&(local_d0.output_)->_vptr_ZeroCopyOutputStream + local_128._8_8_);
  pcVar8 = (char *)0xf;
  if ((char ***)local_d0._0_8_ != pppcVar5) {
    pcVar8 = local_d0.buffer_;
  }
  if (pcVar8 < pcVar2) {
    pcVar8 = (char *)0xf;
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      pcVar8 = (char *)local_128._16_8_;
    }
    if (pcVar2 <= pcVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,local_d0._0_8_);
      goto LAB_0025ac80;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append(&local_d0.variable_delimiter_,local_128._0_8_);
LAB_0025ac80:
  local_148 = &local_138;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_138 = *puVar1;
    uStack_130 = puVar7[3];
  }
  else {
    local_138 = *puVar1;
    local_148 = (undefined8 *)*puVar7;
  }
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((char ***)local_d0._0_8_ != pppcVar5) {
    operator_delete((void *)local_d0._0_8_);
  }
  iVar6 = (*context->_vptr_GeneratorContext[2])(context);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar6);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xe09);
    other = internal::LogMessage::operator<<((LogMessage *)&local_d0,"CHECK failed: output: ");
    internal::LogFinisher::operator=((LogFinisher *)local_128,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_d0);
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_128,(Arena *)0x0,false);
  local_f0._M_dataplus._M_p = (pointer)&PTR_AddAnnotation_004cf430;
  annotation_collector_00 = (string *)0x0;
  if (options->annotate_code != false) {
    annotation_collector_00 = &local_f0;
  }
  local_f0._M_string_length = (size_type)local_128;
  io::Printer::Printer(&local_d0,output,'$',(AnnotationCollector *)annotation_collector_00);
  GenerateFile(local_f8,options,&local_d0,file);
  if ((local_d0.failed_ == false) && (options->annotate_code == true)) {
    anon_unknown_0::EmbedCodeAnnotations((GeneratedCodeInfo *)local_128,&local_d0);
  }
  io::Printer::~Printer(&local_d0);
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_128);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  return (bool)(local_d0.failed_ ^ 1);
}

Assistant:

bool Generator::GenerateFile(const FileDescriptor* file,
                             const GeneratorOptions& options,
                             GeneratorContext* context,
                             bool use_short_name) const {
  std::string filename =
      options.output_dir + "/" +
      GetJSFilename(options, use_short_name
                                 ? file->name().substr(file->name().rfind('/'))
                                 : file->name());
  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(output.get(), '$',
                      options.annotate_code ? &annotation_collector : nullptr);

  GenerateFile(options, &printer, file);

  if (printer.failed()) {
    return false;
  }

  if (options.annotate_code) {
    EmbedCodeAnnotations(annotations, &printer);
  }

  return true;
}